

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

int32_t __thiscall icu_63::RuleBasedCollator::hashCode(RuleBasedCollator *this)

{
  CollationData *this_00;
  UBool UVar1;
  int iVar2;
  UChar32 c;
  uint32_t uVar3;
  undefined4 extraout_var;
  UnicodeSet *uSet;
  bool bVar4;
  undefined1 local_78 [8];
  UnicodeSetIterator iter;
  LocalPointerBase<icu_63::UnicodeSet> local_28;
  LocalPointer<icu_63::UnicodeSet> set;
  UErrorCode errorCode;
  int32_t h;
  RuleBasedCollator *this_local;
  
  set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._4_4_ =
       CollationSettings::hashCode(this->settings);
  this_local._4_4_ = set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._4_4_;
  if (this->data->base != (CollationData *)0x0) {
    set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._0_4_ = U_ZERO_ERROR;
    iVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x1f])(this,&set);
    LocalPointer<icu_63::UnicodeSet>::LocalPointer
              ((LocalPointer<icu_63::UnicodeSet> *)&local_28,
               (UnicodeSet *)CONCAT44(extraout_var,iVar2));
    UVar1 = ::U_FAILURE((UErrorCode)set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr);
    if (UVar1 == '\0') {
      uSet = LocalPointerBase<icu_63::UnicodeSet>::operator*(&local_28);
      UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)local_78,uSet);
      while( true ) {
        UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)local_78);
        bVar4 = false;
        if (UVar1 != '\0') {
          UVar1 = UnicodeSetIterator::isString((UnicodeSetIterator *)local_78);
          bVar4 = UVar1 == '\0';
        }
        if (!bVar4) break;
        this_00 = this->data;
        c = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)local_78);
        uVar3 = CollationData::getCE32(this_00,c);
        set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._4_4_ =
             uVar3 ^ set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._4_4_;
      }
      this_local._4_4_ = set.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._4_4_;
      iter.cpString._0_4_ = 1;
      UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)local_78);
    }
    else {
      this_local._4_4_ = 0;
      iter.cpString._0_4_ = 1;
    }
    LocalPointer<icu_63::UnicodeSet>::~LocalPointer((LocalPointer<icu_63::UnicodeSet> *)&local_28);
  }
  return this_local._4_4_;
}

Assistant:

int32_t
RuleBasedCollator::hashCode() const {
    int32_t h = settings->hashCode();
    if(data->base == NULL) { return h; }  // root collator
    // Do not rely on the rule string, see comments in operator==().
    UErrorCode errorCode = U_ZERO_ERROR;
    LocalPointer<UnicodeSet> set(getTailoredSet(errorCode));
    if(U_FAILURE(errorCode)) { return 0; }
    UnicodeSetIterator iter(*set);
    while(iter.next() && !iter.isString()) {
        h ^= data->getCE32(iter.getCodepoint());
    }
    return h;
}